

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::setUseColour(ConfigData *config,string *value)

{
  bool bVar1;
  runtime_error *this;
  undefined1 local_38 [8];
  string mode;
  string *value_local;
  ConfigData *config_local;
  
  mode.field_2._8_8_ = value;
  toLower((string *)local_38,value);
  bVar1 = std::operator==((string *)local_38,"yes");
  if (bVar1) {
    config->useColour = Yes;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"no");
    if (bVar1) {
      config->useColour = No;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"auto");
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"colour mode must be one of: auto, yes or no");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      config->useColour = Auto;
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

inline void setUseColour( ConfigData& config, std::string const& value ) {
        std::string mode = toLower( value );

        if( mode == "yes" )
            config.useColour = UseColour::Yes;
        else if( mode == "no" )
            config.useColour = UseColour::No;
        else if( mode == "auto" )
            config.useColour = UseColour::Auto;
        else
            throw std::runtime_error( "colour mode must be one of: auto, yes or no" );
    }